

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PhysBCFunct.H
# Opt level: O2

void __thiscall
amrex::GpuBndryFuncFab<PeleLMCCFillExtDir>::nddoit
          (GpuBndryFuncFab<PeleLMCCFillExtDir> *this,Box *bx,FArrayBox *dest,int dcomp,int numcomp,
          Geometry *geom,Real time,Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcr,
          int bcomp,int orig_comp)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  double *pdVar6;
  ProbParm *pPVar7;
  ACParm *pAVar8;
  DataContainer *pDVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  bool bVar13;
  byte bVar14;
  int idim;
  long lVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  GeometryData *pGVar25;
  GeometryData *pGVar26;
  int iVar27;
  int iVar28;
  byte bVar29;
  IntVect IVar30;
  PeleLMCCFillExtDir f_user;
  Box local_224;
  ulong local_208;
  ulong local_200;
  ulong local_1f8;
  GpuBndryFuncFab<PeleLMCCFillExtDir> *local_1f0;
  int local_1e8 [3];
  Box bndry;
  AsyncArray<amrex::BCRec,_0> bcr_aa;
  GeometryData geomdata;
  anon_class_256_9_e3cd3141 local_130;
  
  bVar29 = 0;
  local_1f0 = this;
  IVar30 = Box::length(bx);
  local_1e8[0] = IVar30.vect[0];
  local_1e8[1] = IVar30.vect[1];
  local_1e8[2] = IVar30.vect[2];
  local_224.smallend.vect[0] = (geom->domain).smallend.vect[0];
  local_1f8 = (ulong)(uint)local_224.smallend.vect[0];
  iVar23 = (geom->domain).smallend.vect[1];
  uVar2 = (geom->domain).smallend.vect[2];
  uVar3 = (geom->domain).btype.itype;
  iVar28 = (~uVar3 & 1) + (geom->domain).bigend.vect[0];
  iVar19 = (geom->domain).bigend.vect[1] + (uint)((uVar3 & 2) == 0);
  iVar20 = (geom->domain).bigend.vect[2] + (uint)((uVar3 & 4) == 0);
  local_224.smallend.vect[1] = iVar23;
  local_224.smallend.vect[2] = uVar2;
  local_224.bigend.vect[0] = iVar28;
  local_224.bigend.vect[1] = iVar19;
  local_224.bigend.vect[2] = iVar20;
  local_224.btype.itype = 7;
  for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
    if (*(char *)((long)(geom->super_CoordSys).inv_dx + lVar15 + 0x19) == '\x01') {
      iVar4 = local_1e8[lVar15];
      piVar1 = local_224.smallend.vect + lVar15;
      *piVar1 = *piVar1 - iVar4;
      piVar1 = local_224.bigend.vect + lVar15;
      *piVar1 = *piVar1 + iVar4;
    }
  }
  bVar13 = Box::contains(&local_224,bx);
  if (!bVar13) {
    pdVar6 = (dest->super_BaseFab<double>).dptr;
    iVar4 = (dest->super_BaseFab<double>).nvar;
    uVar3 = (dest->super_BaseFab<double>).domain.smallend.vect[0];
    local_200 = (ulong)uVar3;
    iVar5 = (dest->super_BaseFab<double>).domain.smallend.vect[2];
    lVar15 = (long)(dest->super_BaseFab<double>).domain.smallend.vect[1];
    lVar21 = (long)(dest->super_BaseFab<double>).domain.bigend.vect[1] + 1;
    iVar17 = (dest->super_BaseFab<double>).domain.bigend.vect[0];
    lVar24 = (long)(dest->super_BaseFab<double>).domain.bigend.vect[2] + 1;
    lVar18 = ((long)iVar17 - (long)(int)uVar3) + 1;
    lVar22 = (lVar21 - lVar15) * lVar18;
    local_208 = (ulong)uVar2;
    Geometry::data(geom);
    Gpu::AsyncArray<amrex::BCRec,_0>::AsyncArray
              (&bcr_aa,(bcr->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
                       super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                       super__Vector_impl_data._M_start + bcomp,(long)numcomp);
    lVar16 = (lVar24 - iVar5) * lVar22;
    lVar15 = (lVar15 << 0x20) + local_200;
    lVar21 = (lVar21 << 0x20) + (ulong)(iVar17 + 1);
    pPVar7 = (local_1f0->m_user_f).lprobparm;
    pAVar8 = (local_1f0->m_user_f).lacparm;
    pDVar9 = (local_1f0->m_user_f).lpmfdata;
    f_user.lpmfdata._0_4_ = SUB84(pDVar9,0);
    f_user.lpmfdata._4_4_ = (undefined4)((ulong)pDVar9 >> 0x20);
    f_user.m_do_turbinflow = (int)*(undefined8 *)&(local_1f0->m_user_f).m_do_turbinflow;
    f_user.lacparm._4_4_ = (undefined4)((ulong)pAVar8 >> 0x20);
    bVar14 = (geom->super_CoordSys).field_0x51;
    iVar17 = (int)lVar24;
    if ((bVar14 == 0) && (iVar27 = (int)local_1f8, (bx->smallend).vect[0] < iVar27)) {
      bndry.smallend.vect._0_8_ = *(undefined8 *)(bx->smallend).vect;
      bndry._20_8_ = *(undefined8 *)((bx->bigend).vect + 2);
      bndry.bigend.vect[1] = (int)((ulong)*(undefined8 *)(bx->bigend).vect >> 0x20);
      bndry.smallend.vect[2] = (int)*(undefined8 *)((bx->smallend).vect + 2);
      bndry.bigend.vect[0] = iVar27 + -1;
      local_130.dcomp = dcomp;
      local_130.numcomp = numcomp;
      local_130.fab.p = pdVar6;
      local_130.fab.jstride = lVar18;
      local_130.fab.kstride = lVar22;
      local_130.fab.nstride = lVar16;
      local_130.fab.begin._0_8_ = lVar15;
      local_130.fab.begin.z = iVar5;
      local_130.fab.end._0_8_ = lVar21;
      local_130.fab.end.z = iVar17;
      local_130.fab.ncomp = iVar4;
      local_130.dxhi = iVar27;
      uVar10 = *(undefined8 *)((long)&(local_1f0->m_user_f).lacparm + 4);
      local_130.f_user.lprobparm = (local_1f0->m_user_f).lprobparm;
      local_130.f_user.lacparm._0_4_ = SUB84((local_1f0->m_user_f).lacparm,0);
      local_130.f_user.lacparm._4_4_ = (undefined4)uVar10;
      local_130.f_user.lpmfdata._0_4_ = (undefined4)((ulong)uVar10 >> 0x20);
      local_130.f_user._20_8_ = *(undefined8 *)((long)&(local_1f0->m_user_f).lpmfdata + 4);
      pGVar25 = &geomdata;
      pGVar26 = &local_130.geomdata;
      for (lVar24 = 0xf; lVar24 != 0; lVar24 = lVar24 + -1) {
        (pGVar26->prob_domain).xlo[0] = (pGVar25->prob_domain).xlo[0];
        pGVar25 = (GeometryData *)((long)pGVar25 + (ulong)bVar29 * -0x10 + 8);
        pGVar26 = (GeometryData *)((long)pGVar26 + ((ulong)bVar29 * -2 + 1) * 8);
      }
      local_130.orig_comp = orig_comp;
      local_130.time = time;
      ParallelFor<amrex::GpuBndryFuncFab<PeleLMCCFillExtDir>::nddoit(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int)::_lambda(int,int,int)_1_>
                (&bndry,(anon_class_256_9_c1a331ff *)&local_130);
      bVar14 = (geom->super_CoordSys).field_0x51;
    }
    uVar12 = local_130.f_user.lacparm._0_4_;
    local_130.f_user.lacparm._0_4_ = SUB84(pAVar8,0);
    uVar11 = local_130.f_user.lacparm._0_4_;
    if (((bVar14 & 1) == 0) && (iVar28 < (bx->bigend).vect[0])) {
      uVar10 = *(undefined8 *)(bx->bigend).vect;
      bndry._20_8_ = *(undefined8 *)((bx->bigend).vect + 2);
      bndry.smallend.vect[2] = (int)*(undefined8 *)((bx->smallend).vect + 2);
      bndry.bigend.vect[0] = (int)uVar10;
      bndry.bigend.vect[1] = (int)((ulong)uVar10 >> 0x20);
      bndry.smallend.vect[1] = (int)((ulong)*(undefined8 *)(bx->smallend).vect >> 0x20);
      bndry.smallend.vect[0] = iVar28 + 1;
      local_130.dcomp = dcomp;
      local_130.numcomp = numcomp;
      local_130.fab.p = pdVar6;
      local_130.fab.jstride = lVar18;
      local_130.fab.kstride = lVar22;
      local_130.fab.nstride = lVar16;
      local_130.fab.begin._0_8_ = lVar15;
      local_130.fab.begin.z = iVar5;
      local_130.fab.end._0_8_ = lVar21;
      local_130.fab.end.z = iVar17;
      local_130.fab.ncomp = iVar4;
      local_130.dxhi = iVar28;
      local_130.f_user.lprobparm = pPVar7;
      local_130.f_user.m_do_turbinflow = f_user.m_do_turbinflow;
      local_130.f_user.lpmfdata._4_4_ = f_user.lpmfdata._4_4_;
      local_130.f_user.lacparm._4_4_ = f_user.lacparm._4_4_;
      local_130.f_user.lpmfdata._0_4_ = f_user.lpmfdata._0_4_;
      pGVar25 = &geomdata;
      pGVar26 = &local_130.geomdata;
      for (lVar24 = 0xf; lVar24 != 0; lVar24 = lVar24 + -1) {
        (pGVar26->prob_domain).xlo[0] = (pGVar25->prob_domain).xlo[0];
        pGVar25 = (GeometryData *)((long)pGVar25 + (ulong)bVar29 * -0x10 + 8);
        pGVar26 = (GeometryData *)((long)pGVar26 + ((ulong)bVar29 * -2 + 1) * 8);
      }
      local_130.orig_comp = orig_comp;
      local_130.time = time;
      ParallelFor<amrex::GpuBndryFuncFab<PeleLMCCFillExtDir>::nddoit(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int)::_lambda(int,int,int)_2_>
                (&bndry,&local_130);
      uVar12 = local_130.f_user.lacparm._0_4_;
    }
    local_130.f_user.lacparm._0_4_ = uVar12;
    bVar14 = (geom->super_CoordSys).field_0x52;
    if ((bVar14 == 0) && ((bx->smallend).vect[1] < iVar23)) {
      bndry.smallend.vect._0_8_ = *(undefined8 *)(bx->smallend).vect;
      uVar10 = *(undefined8 *)((bx->smallend).vect + 2);
      bndry._20_8_ = *(undefined8 *)((bx->bigend).vect + 2);
      bndry.smallend.vect[2] = (int)uVar10;
      bndry.bigend.vect[0] = (int)((ulong)uVar10 >> 0x20);
      bndry.bigend.vect[1] = iVar23 + -1;
      local_130.dcomp = dcomp;
      local_130.numcomp = numcomp;
      local_130.fab.p = pdVar6;
      local_130.fab.jstride = lVar18;
      local_130.fab.kstride = lVar22;
      local_130.fab.nstride = lVar16;
      local_130.fab.begin._0_8_ = lVar15;
      local_130.fab.begin.z = iVar5;
      local_130.fab.end._0_8_ = lVar21;
      local_130.fab.end.z = iVar17;
      local_130.fab.ncomp = iVar4;
      local_130.dxhi = iVar23;
      local_130.f_user.lprobparm = pPVar7;
      local_130.f_user.m_do_turbinflow = f_user.m_do_turbinflow;
      local_130.f_user.lpmfdata._4_4_ = f_user.lpmfdata._4_4_;
      local_130.f_user.lacparm._4_4_ = f_user.lacparm._4_4_;
      local_130.f_user.lpmfdata._0_4_ = f_user.lpmfdata._0_4_;
      pGVar25 = &geomdata;
      pGVar26 = &local_130.geomdata;
      for (lVar24 = 0xf; lVar24 != 0; lVar24 = lVar24 + -1) {
        (pGVar26->prob_domain).xlo[0] = (pGVar25->prob_domain).xlo[0];
        pGVar25 = (GeometryData *)((long)pGVar25 + (ulong)bVar29 * -0x10 + 8);
        pGVar26 = (GeometryData *)((long)pGVar26 + ((ulong)bVar29 * -2 + 1) * 8);
      }
      local_130.orig_comp = orig_comp;
      local_130.f_user.lacparm._0_4_ = uVar11;
      local_130.time = time;
      ParallelFor<amrex::GpuBndryFuncFab<PeleLMCCFillExtDir>::nddoit(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int)::_lambda(int,int,int)_3_>
                (&bndry,(anon_class_256_9_29845ede *)&local_130);
      bVar14 = (geom->super_CoordSys).field_0x52;
    }
    if (((bVar14 & 1) == 0) && (iVar19 < (bx->bigend).vect[1])) {
      uVar10 = *(undefined8 *)(bx->bigend).vect;
      bndry._20_8_ = *(undefined8 *)((bx->bigend).vect + 2);
      bndry.smallend.vect[2] = (int)*(undefined8 *)((bx->smallend).vect + 2);
      bndry.bigend.vect[0] = (int)uVar10;
      bndry.bigend.vect[1] = (int)((ulong)uVar10 >> 0x20);
      bndry.smallend.vect[0] = (int)*(undefined8 *)(bx->smallend).vect;
      bndry.smallend.vect[1] = iVar19 + 1;
      local_130.dcomp = dcomp;
      local_130.numcomp = numcomp;
      local_130.fab.p = pdVar6;
      local_130.fab.jstride = lVar18;
      local_130.fab.kstride = lVar22;
      local_130.fab.nstride = lVar16;
      local_130.fab.begin._0_8_ = lVar15;
      local_130.fab.begin.z = iVar5;
      local_130.fab.end._0_8_ = lVar21;
      local_130.fab.end.z = iVar17;
      local_130.fab.ncomp = iVar4;
      local_130.dxhi = iVar19;
      local_130.f_user.lprobparm = pPVar7;
      local_130.f_user.m_do_turbinflow = f_user.m_do_turbinflow;
      local_130.f_user.lpmfdata._4_4_ = f_user.lpmfdata._4_4_;
      local_130.f_user.lacparm._4_4_ = f_user.lacparm._4_4_;
      local_130.f_user.lpmfdata._0_4_ = f_user.lpmfdata._0_4_;
      pGVar25 = &geomdata;
      pGVar26 = &local_130.geomdata;
      for (lVar24 = 0xf; lVar24 != 0; lVar24 = lVar24 + -1) {
        (pGVar26->prob_domain).xlo[0] = (pGVar25->prob_domain).xlo[0];
        pGVar25 = (GeometryData *)((long)pGVar25 + (ulong)bVar29 * -0x10 + 8);
        pGVar26 = (GeometryData *)((long)pGVar26 + ((ulong)bVar29 * -2 + 1) * 8);
      }
      local_130.orig_comp = orig_comp;
      local_130.f_user.lacparm._0_4_ = uVar11;
      local_130.time = time;
      ParallelFor<amrex::GpuBndryFuncFab<PeleLMCCFillExtDir>::nddoit(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int)::_lambda(int,int,int)_4_>
                (&bndry,(anon_class_256_9_4bae5e20 *)&local_130);
    }
    bVar14 = (geom->super_CoordSys).field_0x53;
    if ((bVar14 == 0) && (iVar23 = (int)local_208, (bx->smallend).vect[2] < iVar23)) {
      bndry.smallend.vect._0_8_ = *(undefined8 *)(bx->smallend).vect;
      uVar10 = *(undefined8 *)((bx->smallend).vect + 2);
      bndry.bigend.vect[1] = (int)((ulong)*(undefined8 *)(bx->bigend).vect >> 0x20);
      bndry.smallend.vect[2] = (int)uVar10;
      bndry.bigend.vect[0] = (int)((ulong)uVar10 >> 0x20);
      bndry.btype.itype = (uint)((ulong)*(undefined8 *)((bx->bigend).vect + 2) >> 0x20);
      bndry.bigend.vect[2] = iVar23 + -1;
      local_130.dcomp = dcomp;
      local_130.numcomp = numcomp;
      local_130.fab.p = pdVar6;
      local_130.fab.jstride = lVar18;
      local_130.fab.kstride = lVar22;
      local_130.fab.nstride = lVar16;
      local_130.fab.begin._0_8_ = lVar15;
      local_130.fab.begin.z = iVar5;
      local_130.fab.end._0_8_ = lVar21;
      local_130.fab.end.z = iVar17;
      local_130.fab.ncomp = iVar4;
      local_130.dxhi = iVar23;
      local_130.f_user.lprobparm = pPVar7;
      local_130.f_user.m_do_turbinflow = f_user.m_do_turbinflow;
      local_130.f_user.lpmfdata._4_4_ = f_user.lpmfdata._4_4_;
      local_130.f_user.lacparm._4_4_ = f_user.lacparm._4_4_;
      local_130.f_user.lpmfdata._0_4_ = f_user.lpmfdata._0_4_;
      pGVar25 = &geomdata;
      pGVar26 = &local_130.geomdata;
      for (lVar24 = 0xf; lVar24 != 0; lVar24 = lVar24 + -1) {
        (pGVar26->prob_domain).xlo[0] = (pGVar25->prob_domain).xlo[0];
        pGVar25 = (GeometryData *)((long)pGVar25 + (ulong)bVar29 * -0x10 + 8);
        pGVar26 = (GeometryData *)((long)pGVar26 + ((ulong)bVar29 * -2 + 1) * 8);
      }
      local_130.orig_comp = orig_comp;
      local_130.f_user.lacparm._0_4_ = uVar11;
      local_130.time = time;
      ParallelFor<amrex::GpuBndryFuncFab<PeleLMCCFillExtDir>::nddoit(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int)::_lambda(int,int,int)_5_>
                (&bndry,(anon_class_256_9_91658bbd *)&local_130);
      bVar14 = (geom->super_CoordSys).field_0x53;
    }
    if (((bVar14 & 1) == 0) && (iVar20 < (bx->bigend).vect[2])) {
      bndry.smallend.vect._0_8_ = *(undefined8 *)(bx->smallend).vect;
      uVar10 = *(undefined8 *)(bx->bigend).vect;
      bndry._20_8_ = *(undefined8 *)((bx->bigend).vect + 2);
      bndry.bigend.vect[0] = (int)uVar10;
      bndry.bigend.vect[1] = (int)((ulong)uVar10 >> 0x20);
      bndry.smallend.vect[2] = iVar20 + 1;
      local_130.dcomp = dcomp;
      local_130.numcomp = numcomp;
      local_130.fab.p = pdVar6;
      local_130.fab.jstride = lVar18;
      local_130.fab.kstride = lVar22;
      local_130.fab.nstride = lVar16;
      local_130.fab.begin._0_8_ = lVar15;
      local_130.fab.begin.z = iVar5;
      local_130.fab.end._0_8_ = lVar21;
      local_130.fab.end.z = iVar17;
      local_130.fab.ncomp = iVar4;
      local_130.dxhi = iVar20;
      local_130.f_user.lprobparm = pPVar7;
      local_130.f_user.m_do_turbinflow = f_user.m_do_turbinflow;
      local_130.f_user.lpmfdata._4_4_ = f_user.lpmfdata._4_4_;
      local_130.f_user.lacparm._4_4_ = f_user.lacparm._4_4_;
      local_130.f_user.lpmfdata._0_4_ = f_user.lpmfdata._0_4_;
      pGVar25 = &geomdata;
      pGVar26 = &local_130.geomdata;
      for (lVar15 = 0xf; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pGVar26->prob_domain).xlo[0] = (pGVar25->prob_domain).xlo[0];
        pGVar25 = (GeometryData *)((long)pGVar25 + (ulong)bVar29 * -0x10 + 8);
        pGVar26 = (GeometryData *)((long)pGVar26 + ((ulong)bVar29 * -2 + 1) * 8);
      }
      local_130.orig_comp = orig_comp;
      local_130.f_user.lacparm._0_4_ = uVar11;
      local_130.time = time;
      ParallelFor<amrex::GpuBndryFuncFab<PeleLMCCFillExtDir>::nddoit(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int)::_lambda(int,int,int)_6_>
                (&bndry,(anon_class_256_9_b38f8aff *)&local_130);
    }
    Gpu::AsyncArray<amrex::BCRec,_0>::~AsyncArray(&bcr_aa);
  }
  return;
}

Assistant:

void
GpuBndryFuncFab<F>::nddoit (Box const& bx, FArrayBox& dest,
                            const int dcomp, const int numcomp,
                            Geometry const& geom, const Real time,
                            const Vector<BCRec>& bcr, const int bcomp,
                            const int orig_comp)
{
    const IntVect& len = bx.length();

    Box const& domain = amrex::convert(geom.Domain(),IntVect::TheNodeVector());
    Box gdomain = domain;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        if (geom.isPeriodic(idim)) {
            gdomain.grow(idim,len[idim]);
        }
    }

    if (gdomain.contains(bx)) return;

    Array4<Real> const& fab = dest.array();
    const auto geomdata = geom.data();

    AsyncArray<BCRec> bcr_aa(bcr.data()+bcomp, numcomp);
    BCRec* bcr_p = bcr_aa.data();

    const auto f_user = m_user_f;

    // xlo
    if (!geom.isPeriodic(0) && bx.smallEnd(0) < domain.smallEnd(0)) {
        Box bndry = bx;
        int dxlo = domain.smallEnd(0);
        bndry.setBig(0,dxlo-1);
        amrex::ParallelFor(bndry, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            for (int n = dcomp; n < dcomp+numcomp; ++n) {
                fab(i,j,k,n) = fab(dxlo,j,k,n);
            }
            f_user(IntVect(AMREX_D_DECL(i,j,k)), fab, dcomp, numcomp, geomdata, time,
                   bcr_p, 0, orig_comp);
        });
    }

    // xhi
    if (!geom.isPeriodic(0) && bx.bigEnd(0) > domain.bigEnd(0)) {
        Box bndry = bx;
        int dxhi = domain.bigEnd(0);
        bndry.setSmall(0,dxhi+1);
        amrex::ParallelFor(bndry, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            for (int n = dcomp; n < dcomp+numcomp; ++n) {
                fab(i,j,k,n) = fab(dxhi,j,k,n);
            }
            f_user(IntVect(AMREX_D_DECL(i,j,k)), fab, dcomp, numcomp, geomdata, time,
                   bcr_p, 0, orig_comp);
        });
    }

#if (AMREX_SPACEDIM >= 2)
    // ylo
    if (!geom.isPeriodic(1) && bx.smallEnd(1) < domain.smallEnd(1)) {
        Box bndry = bx;
        int dylo = domain.smallEnd(1);
        bndry.setBig(1,dylo-1);
        amrex::ParallelFor(bndry, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            for (int n = dcomp; n < dcomp+numcomp; ++n) {
                fab(i,j,k,n) = fab(i,dylo,k,n);
            }
            f_user(IntVect(AMREX_D_DECL(i,j,k)), fab, dcomp, numcomp, geomdata, time,
                   bcr_p, 0, orig_comp);
        });
    }

    // yhi
    if (!geom.isPeriodic(1) && bx.bigEnd(1) > domain.bigEnd(1)) {
        Box bndry = bx;
        int dyhi = domain.bigEnd(1);
        bndry.setSmall(1,dyhi+1);
        amrex::ParallelFor(bndry, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            for (int n = dcomp; n < dcomp+numcomp; ++n) {
                fab(i,j,k,n) = fab(i,dyhi,k,n);
            }
            f_user(IntVect(AMREX_D_DECL(i,j,k)), fab, dcomp, numcomp, geomdata, time,
                   bcr_p, 0, orig_comp);
        });
    }
#endif

#if (AMREX_SPACEDIM == 3)
    // zlo
    if (!geom.isPeriodic(2) && bx.smallEnd(2) < domain.smallEnd(2)) {
        Box bndry = bx;
        int dzlo = domain.smallEnd(2);
        bndry.setBig(2,dzlo-1);
        amrex::ParallelFor(bndry, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            for (int n = dcomp; n < dcomp+numcomp; ++n) {
                fab(i,j,k,n) = fab(i,j,dzlo,n);
            }
            f_user(IntVect(AMREX_D_DECL(i,j,k)), fab, dcomp, numcomp, geomdata, time,
                   bcr_p, 0, orig_comp);
        });
    }

    // zhi
    if (!geom.isPeriodic(2) && bx.bigEnd(2) > domain.bigEnd(2)) {
        Box bndry = bx;
        int dzhi = domain.bigEnd(2);
        bndry.setSmall(2,dzhi+1);
        amrex::ParallelFor(bndry, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            for (int n = dcomp; n < dcomp+numcomp; ++n) {
                fab(i,j,k,n) = fab(i,j,dzhi,n);
            }
            f_user(IntVect(AMREX_D_DECL(i,j,k)), fab, dcomp, numcomp, geomdata, time,
                   bcr_p, 0, orig_comp);
        });
    }
#endif
}